

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O2

QDBusVariant * __thiscall
QDBusMenuAdaptor::GetProperty
          (QDBusVariant *__return_storage_ptr__,QDBusMenuAdaptor *this,int id,QString *name)

{
  QLoggingCategory *pQVar1;
  QDebug *this_00;
  long in_FS_OFFSET;
  QDebug local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcMenu();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    this_00 = QDebug::operator<<(&local_30,id);
    QDebug::operator<<(this_00,name);
    QDebug::~QDebug(&local_30);
  }
  (__return_storage_ptr__->m_variant).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->m_variant).d.data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->m_variant).d.data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->m_variant).d.field_0x18 = 2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDBusVariant QDBusMenuAdaptor::GetProperty(int id, const QString &name)
{
    qCDebug(qLcMenu) << id << name;
    // handle method call com.canonical.dbusmenu.GetProperty
    QDBusVariant value;
    return value;
}